

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O0

gtoken_t gravity_lexer_peek(gravity_lexer_t *lexer)

{
  undefined1 local_78 [4];
  gtoken_t result;
  gravity_lexer_t saved;
  gravity_lexer_t *lexer_local;
  
  if (lexer->cache == TOK_END) {
    lexer->peeking = true;
    saved._88_8_ = lexer;
    memcpy(local_78,lexer,0x60);
    lexer_local._4_4_ = gravity_lexer_next((gravity_lexer_t *)saved._88_8_);
    memcpy((void *)saved._88_8_,local_78,0x60);
    *(undefined1 *)(saved._88_8_ + 0x48) = 0;
    *(gtoken_t *)(saved._88_8_ + 0x58) = lexer_local._4_4_;
  }
  else {
    lexer_local._4_4_ = lexer->cache;
  }
  return lexer_local._4_4_;
}

Assistant:

gtoken_t gravity_lexer_peek (gravity_lexer_t *lexer) {
    if (lexer->cache != TOK_END) return lexer->cache;
    
    lexer->peeking = true;
    gravity_lexer_t saved = *lexer;

    gtoken_t result = gravity_lexer_next(lexer);

    *lexer = saved;
    lexer->peeking = false;

    lexer->cache = result;
    return result;
}